

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O2

uint32_t __thiscall BufferedReader::getReaderCount(BufferedReader *this)

{
  size_t sVar1;
  
  std::mutex::lock(&this->m_readersMtx);
  sVar1 = (this->m_readers)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_readersMtx);
  return (uint32_t)sVar1;
}

Assistant:

uint32_t BufferedReader::getReaderCount()
{
    std::lock_guard lock(m_readersMtx);
    return static_cast<uint32_t>(m_readers.size());
}